

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeRGBA8ColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,PixelBufferAccess *colorBuffer)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar1 = (colorBuffer->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  iVar2 = (colorBuffer->super_ConstPixelBufferAccess).m_pitch.m_data[2];
  pvVar3 = (colorBuffer->super_ConstPixelBufferAccess).m_data;
  pfVar9 = &this->m_sampleRegister[0].blendedA;
  uVar11 = 0;
  do {
    if (((SampleData *)(pfVar9 + -0x18))->isAlive == true) {
      uVar4 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
      iVar6 = (int)((long)uVar4 / (long)numSamplesPerFragment) + fragNdxOffset;
      lVar5 = (long)(inputFragments[iVar6].pixelCoord.m_data[0] * iVar1) +
              ((long)uVar4 % (long)numSamplesPerFragment & 0xffffffffU) * 4;
      lVar8 = (long)(inputFragments[iVar6].pixelCoord.m_data[1] * iVar2);
      uVar7 = 0x7e - ((int)((Vec3 *)(pfVar9 + -3))->m_data[0] >> 0x17);
      uVar10 = (((uint)((Vec3 *)(pfVar9 + -3))->m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >>
               ((byte)uVar7 & 0x1f)) + 0x800000;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      *(char *)((long)pvVar3 + lVar8 + lVar5) = (char)(uVar10 >> 0x18);
      uVar7 = 0x7e - ((int)pfVar9[-2] >> 0x17);
      uVar10 = (((uint)pfVar9[-2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) +
               0x800000;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      *(char *)((long)pvVar3 + lVar8 + 1 + lVar5) = (char)(uVar10 >> 0x18);
      uVar7 = 0x7e - ((int)pfVar9[-1] >> 0x17);
      uVar10 = (((uint)pfVar9[-1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) +
               0x800000;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      *(char *)((long)pvVar3 + lVar8 + 2 + lVar5) = (char)(uVar10 >> 0x18);
      uVar7 = 0x7e - ((int)*pfVar9 >> 0x17);
      uVar10 = (((uint)*pfVar9 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar7 & 0x1f)) + 0x800000;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      *(char *)((long)pvVar3 + lVar8 + 3 + lVar5) = (char)(uVar10 >> 0x18);
    }
    uVar11 = uVar11 + 1;
    pfVar9 = pfVar9 + 0x21;
  } while (uVar11 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeRGBA8ColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::PixelBufferAccess& colorBuffer)
{
	const int		fragStride	= 4;
	const int		xStride		= colorBuffer.getRowPitch();
	const int		yStride		= colorBuffer.getSlicePitch();
	deUint8* const	basePtr		= (deUint8*)colorBuffer.getDataPtr();

	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			const int			fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			deUint8*			dstPtr			= basePtr + fragSampleNdx*fragStride + frag.pixelCoord.x()*xStride + frag.pixelCoord.y()*yStride;

			dstPtr[0] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.x());
			dstPtr[1] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.y());
			dstPtr[2] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.z());
			dstPtr[3] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedA);
		}
	}
}